

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O0

void print_ops(void)

{
  bool bVar1;
  ushort opcode_00;
  uint uVar2;
  u32 *puVar3;
  uint uStack_1094;
  u16 opcode;
  Bool skipped;
  int distinct;
  u64 total;
  char mnemonic [100];
  uint local_101c;
  u8 op;
  u32 i;
  U32Pair pairs [512];
  u32 *cb_opcode_count;
  u32 *opcode_count;
  
  puVar3 = emulator_get_opcode_count();
  pairs[0x1ff] = (U32Pair)emulator_get_cb_opcode_count();
  memset(&stack0xffffffffffffefe8,0,0x1000);
  for (local_101c = 0; local_101c < 0x200; local_101c = local_101c + 2) {
    uVar2 = local_101c >> 1;
    mnemonic[99] = (char)uVar2;
    pairs[(ulong)local_101c - 1].value = uVar2 & 0xff;
    pairs[(ulong)local_101c - 1].count = puVar3[(byte)mnemonic[99]];
    pairs[(ulong)(local_101c + 1) - 1].value = uVar2 & 0xff | 0xcb00;
    pairs[(ulong)(local_101c + 1) - 1].count =
         *(u32 *)((long)pairs[0x1ff] + (ulong)(byte)mnemonic[99] * 4);
  }
  qsort(&stack0xffffffffffffefe8,0x200,8,compare_pair);
  printf("  op:      count -   mnemonic\n");
  printf("--------------------------------\n");
  _skipped = 0;
  uStack_1094 = 0;
  bVar1 = false;
  local_101c = 0;
  do {
    if (0x1ff < local_101c) {
      if (bVar1) {
        printf("  ...\n");
      }
      printf("distinct: %d\n",(ulong)uStack_1094);
      printf("total: %lu\n",_skipped);
      return;
    }
    if (pairs[(ulong)local_101c - 1].count != 0) {
      opcode_00 = (ushort)pairs[(ulong)local_101c - 1].value;
      if (local_101c < s_print_ops_limit) {
        if (opcode_00 == 0xcb) goto LAB_00125468;
        if (opcode_00 < 0x100) {
          printf("  %02x",(ulong)opcode_00);
        }
        else {
          printf("%04x",(ulong)opcode_00);
        }
        emulator_get_opcode_mnemonic(opcode_00,(char *)&total,100);
        printf(": %10d - %s\n",(ulong)pairs[(ulong)local_101c - 1].count,&total);
      }
      else {
        bVar1 = true;
      }
      uStack_1094 = uStack_1094 + 1;
      _skipped = (ulong)pairs[(ulong)local_101c - 1].count + _skipped;
    }
LAB_00125468:
    local_101c = local_101c + 1;
  } while( true );
}

Assistant:

void print_ops(void) {
  u32* opcode_count = emulator_get_opcode_count();
  u32* cb_opcode_count = emulator_get_cb_opcode_count();

  U32Pair pairs[512];
  ZERO_MEMORY(pairs);

  u32 i;
  for (i = 0; i < 512; i += 2) {
    u8 op = i / 2;
    pairs[i].value = op;
    pairs[i].count = opcode_count[op];
    pairs[i + 1].value = 0xcb00 | op;
    pairs[i + 1].count = cb_opcode_count[op];
  }

  qsort(pairs, ARRAY_SIZE(pairs), sizeof(pairs[0]), compare_pair);

  printf("  op:      count -   mnemonic\n");
  printf("--------------------------------\n");
  char mnemonic[100];
  u64 total = 0;
  int distinct = 0;
  Bool skipped = FALSE;
  for (i = 0; i < 512; ++i) {
    if (pairs[i].count > 0) {
      u16 opcode = pairs[i].value;
      if (i < s_print_ops_limit) {
        if (opcode == 0xcb) continue;
        if (opcode < 0x100) {
          printf("  %02x", opcode);
        } else {
          printf("%04x", opcode);
        }
        emulator_get_opcode_mnemonic(opcode, mnemonic, sizeof(mnemonic));
        printf(": %10d - %s\n", pairs[i].count, mnemonic);
      } else {
        skipped = TRUE;
      }
      ++distinct;
      total += pairs[i].count;
    }
  }
  if (skipped) {
    printf("  ...\n");
  }
  printf("distinct: %d\n", distinct);
  printf("total: %" PRIu64 "\n", total);
}